

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result,FlatAllocator *alloc)

{
  FlatAllocator *descriptor;
  MethodDescriptor *parent_00;
  ServiceDescriptor *pSVar1;
  bool bVar2;
  string *psVar3;
  Symbol local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  char *local_38;
  FlatAllocator *local_30;
  FlatAllocator *alloc_local;
  MethodDescriptor *result_local;
  ServiceDescriptor *parent_local;
  MethodDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  result->service_ = parent;
  local_30 = alloc;
  alloc_local = (FlatAllocator *)result;
  result_local = (MethodDescriptor *)parent;
  parent_local = (ServiceDescriptor *)proto;
  proto_local = (MethodDescriptorProto *)this;
  local_48 = ServiceDescriptor::full_name(parent);
  psVar3 = MethodDescriptorProto::name_abi_cxx11_((MethodDescriptorProto *)parent_local);
  local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3)
  ;
  local_38 = (char *)AllocateNameStrings(this,local_48,local_58,(Message *)parent_local,local_30);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = (PointerT<std::__cxx11::basic_string<char>_>)local_38;
  psVar3 = MethodDescriptorProto::name_abi_cxx11_((MethodDescriptorProto *)parent_local);
  local_68 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3)
  ;
  local_78 = MethodDescriptor::full_name((MethodDescriptor *)alloc_local);
  ValidateSymbolName(this,local_68,local_78,(Message *)parent_local);
  internal::LazyDescriptor::Init
            ((LazyDescriptor *)
             &(alloc_local->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ).pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>);
  internal::LazyDescriptor::Init
            ((LazyDescriptor *)
             &(alloc_local->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ).pointers_.payload_.super_Base<google::protobuf::MessageOptions>);
  pSVar1 = parent_local;
  descriptor = alloc_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"google.protobuf.MethodOptions");
  AllocateOptions<google::protobuf::MethodDescriptor>
            (this,(Proto *)pSVar1,(MethodDescriptor *)descriptor,4,local_88,local_30);
  bVar2 = MethodDescriptorProto::client_streaming((MethodDescriptorProto *)parent_local);
  *(bool *)((long)&(alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<char>.value + 1) = bVar2;
  bVar2 = MethodDescriptorProto::server_streaming((MethodDescriptorProto *)parent_local);
  *(bool *)((long)&(alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<char>.value + 2) = bVar2;
  local_98 = MethodDescriptor::full_name((MethodDescriptor *)alloc_local);
  parent_00 = result_local;
  local_a8 = MethodDescriptor::name((MethodDescriptor *)alloc_local);
  pSVar1 = parent_local;
  Symbol::Symbol(&local_b0,(MethodDescriptor *)alloc_local);
  AddSymbol(this,local_98,parent_00,local_a8,(Message *)pSVar1,local_b0);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result,
                                    internal::FlatAllocator& alloc) {
  result->service_ = parent;
  result->all_names_ =
      AllocateNameStrings(parent->full_name(), proto.name(), proto, alloc);

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  AllocateOptions(proto, result, MethodDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.MethodOptions", alloc);

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}